

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

idx_t duckdb::FindRangeBound<duckdb::LessThan,true>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  double dVar2;
  undefined1 auVar3 [12];
  byte bVar4;
  char cVar5;
  bool bVar6;
  short sVar7;
  unsigned_short uVar8;
  uint uVar9;
  int iVar10;
  reference pvVar11;
  OutOfRangeException *pOVar12;
  unsigned_long uVar13;
  ulong uVar14;
  InternalException *this;
  bool bVar15;
  ulong uVar16;
  WindowInputExpression *pWVar17;
  idx_t iVar18;
  idx_t iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int64_t lmicros;
  long lVar23;
  long lVar24;
  float fVar25;
  hugeint_t hVar26;
  interval_t iVar27;
  WindowColumnIterator<duckdb::hugeint_t> WVar28;
  WindowColumnIterator<unsigned_long> WVar29;
  WindowColumnIterator<short> WVar30;
  WindowColumnIterator<unsigned_int> WVar31;
  WindowColumnIterator<signed_char> WVar32;
  WindowColumnIterator<unsigned_short> WVar33;
  WindowColumnIterator<unsigned_char> WVar34;
  WindowColumnIterator<int> WVar35;
  WindowColumnIterator<long> WVar36;
  WindowColumnIterator<double> WVar37;
  WindowColumnIterator<float> WVar38;
  WindowColumnIterator<duckdb::uhugeint_t> WVar39;
  WindowColumnIterator<duckdb::interval_t> WVar40;
  WindowColumnIterator<duckdb::hugeint_t> __last;
  WindowColumnIterator<unsigned_long> __last_00;
  WindowColumnIterator<short> __last_01;
  WindowColumnIterator<unsigned_int> __last_02;
  WindowColumnIterator<signed_char> __last_03;
  WindowColumnIterator<unsigned_short> __last_04;
  WindowColumnIterator<unsigned_char> __last_05;
  WindowColumnIterator<int> __last_06;
  WindowColumnIterator<long> __last_07;
  WindowColumnIterator<double> __last_08;
  WindowColumnIterator<float> __last_09;
  WindowColumnIterator<duckdb::uhugeint_t> __last_10;
  WindowColumnIterator<duckdb::interval_t> __last_11;
  uchar val;
  OperationCompare<unsigned_char,_duckdb::LessThan> comp;
  double cur_val;
  _Any_data local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  interval_t local_78;
  _Any_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  uhugeint_t local_40;
  
  auVar3 = (undefined1  [12])local_40._4_12_;
  PVar1 = boundary->ptype;
  switch(PVar1) {
  case UINT8:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78.months._0_1_ = pvVar11->data[chunk_idx];
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar4 = WindowCursor::GetCell<unsigned_char>(range_hi,0,order_end - 1);
      if (bVar4 < (byte)local_78.months) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar4 = WindowCursor::GetCell<unsigned_char>(range_lo,0,order_begin);
      if ((byte)local_78.months < bVar4) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        bVar4 = WindowCursor::GetCell<unsigned_char>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (bVar4 < (byte)local_78.months) {
          iVar18 = iVar19;
        }
        if ((byte)local_78.months < bVar4) {
          iVar18 = order_begin;
        }
        if ((byte)local_78.months >= bVar4 && (byte)local_78.months <= bVar4) goto LAB_017cec00;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        bVar4 = WindowCursor::GetCell<unsigned_char>(range_hi,0,uVar14 - 1);
        if ((byte)local_78.months <= bVar4) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&local_98,
               (function<bool_(unsigned_char,_unsigned_char)> *)&local_68);
    WVar34.pos = iVar18;
    WVar34.coll = range_lo;
    __last_05.pos = order_end;
    __last_05.coll = range_hi;
    WVar34 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::LessThan>>
                       (WVar34,__last_05,(uchar *)&local_78,
                        (OperationCompare<unsigned_char,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar34.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017cec00:
    if ((code *)local_58._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    }
    return iVar19;
  case INT8:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78.months._0_1_ = pvVar11->data[chunk_idx];
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar5 = WindowCursor::GetCell<signed_char>(range_hi,0,order_end - 1);
      if (cVar5 < (char)(byte)local_78.months) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar5 = WindowCursor::GetCell<signed_char>(range_lo,0,order_begin);
      if ((char)(byte)local_78.months < cVar5) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        cVar5 = WindowCursor::GetCell<signed_char>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (cVar5 < (char)(byte)local_78.months) {
          iVar18 = iVar19;
        }
        if ((char)(byte)local_78.months < cVar5) {
          iVar18 = order_begin;
        }
        if (cVar5 <= (char)(byte)local_78.months && (char)(byte)local_78.months <= cVar5)
        goto LAB_017ceb2a;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        cVar5 = WindowCursor::GetCell<signed_char>(range_hi,0,uVar14 - 1);
        if ((char)(byte)local_78.months <= cVar5) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&local_98,
               (function<bool_(signed_char,_signed_char)> *)&local_68);
    WVar32.pos = iVar18;
    WVar32.coll = range_lo;
    __last_03.pos = order_end;
    __last_03.coll = range_hi;
    WVar32 = ::std::
             lower_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::LessThan>>
                       (WVar32,__last_03,(char *)&local_78,
                        (OperationCompare<signed_char,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar32.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017ceb2a:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return iVar19;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return iVar19;
  case UINT16:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78.months._0_2_ = *(undefined2 *)(pvVar11->data + chunk_idx * 2);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar8 = WindowCursor::GetCell<unsigned_short>(range_hi,0,order_end - 1);
      if (uVar8 < (ushort)local_78.months) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar8 = WindowCursor::GetCell<unsigned_short>(range_lo,0,order_begin);
      if ((ushort)local_78.months < uVar8) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        uVar8 = WindowCursor::GetCell<unsigned_short>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (uVar8 < (ushort)local_78.months) {
          iVar18 = iVar19;
        }
        if ((ushort)local_78.months < uVar8) {
          iVar18 = order_begin;
        }
        if ((ushort)local_78.months >= uVar8 && (ushort)local_78.months <= uVar8) goto LAB_017ceb95;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        uVar8 = WindowCursor::GetCell<unsigned_short>(range_hi,0,uVar14 - 1);
        if ((ushort)local_78.months <= uVar8) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&local_98,
               (function<bool_(unsigned_short,_unsigned_short)> *)&local_68);
    WVar33.pos = iVar18;
    WVar33.coll = range_lo;
    __last_04.pos = order_end;
    __last_04.coll = range_hi;
    WVar33 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::LessThan>>
                       (WVar33,__last_04,(unsigned_short *)&local_78,
                        (OperationCompare<unsigned_short,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar33.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017ceb95:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return iVar19;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return iVar19;
  case INT16:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78.months._0_2_ = *(undefined2 *)(pvVar11->data + chunk_idx * 2);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar7 = WindowCursor::GetCell<short>(range_hi,0,order_end - 1);
      if (sVar7 < (short)(ushort)local_78.months) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar7 = WindowCursor::GetCell<short>(range_lo,0,order_begin);
      if ((short)(ushort)local_78.months < sVar7) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        sVar7 = WindowCursor::GetCell<short>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (sVar7 < (short)(ushort)local_78.months) {
          iVar18 = iVar19;
        }
        if ((short)(ushort)local_78.months < sVar7) {
          iVar18 = order_begin;
        }
        if (sVar7 <= (short)(ushort)local_78.months && (short)(ushort)local_78.months <= sVar7)
        goto LAB_017cea54;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        sVar7 = WindowCursor::GetCell<short>(range_hi,0,uVar14 - 1);
        if ((short)(ushort)local_78.months <= sVar7) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&local_98,(function<bool_(short,_short)> *)&local_68
              );
    WVar30.pos = iVar18;
    WVar30.coll = range_lo;
    __last_01.pos = order_end;
    __last_01.coll = range_hi;
    WVar30 = ::std::
             lower_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::LessThan>>
                       (WVar30,__last_01,(short *)&local_78,
                        (OperationCompare<short,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar30.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017cea54:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return iVar19;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return iVar19;
  case UINT32:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78.months = *(int32_t *)(pvVar11->data + chunk_idx * 4);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar9 = WindowCursor::GetCell<unsigned_int>(range_hi,0,order_end - 1);
      if (uVar9 < (uint)local_78.months) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar9 = WindowCursor::GetCell<unsigned_int>(range_lo,0,order_begin);
      if ((uint)local_78.months < uVar9) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        uVar9 = WindowCursor::GetCell<unsigned_int>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (uVar9 < (uint)local_78.months) {
          iVar18 = iVar19;
        }
        if ((uint)local_78.months < uVar9) {
          iVar18 = order_begin;
        }
        if ((uint)local_78.months >= uVar9 && (uint)local_78.months <= uVar9) goto LAB_017ceabf;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        uVar9 = WindowCursor::GetCell<unsigned_int>(range_hi,0,uVar14 - 1);
        if ((uint)local_78.months <= uVar9) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&local_98,
               (function<bool_(unsigned_int,_unsigned_int)> *)&local_68);
    WVar31.pos = iVar18;
    WVar31.coll = range_lo;
    __last_02.pos = order_end;
    __last_02.coll = range_hi;
    WVar31 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::LessThan>>
                       (WVar31,__last_02,(uint *)&local_78,
                        (OperationCompare<unsigned_int,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar31.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017ceabf:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return iVar19;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return iVar19;
  case INT32:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78.months = *(int32_t *)(pvVar11->data + chunk_idx * 4);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar10 = WindowCursor::GetCell<int>(range_hi,0,order_end - 1);
      if (iVar10 < local_78.months) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar10 = WindowCursor::GetCell<int>(range_lo,0,order_begin);
      if (local_78.months < iVar10) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        iVar10 = WindowCursor::GetCell<int>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (iVar10 < local_78.months) {
          iVar18 = iVar19;
        }
        if (local_78.months < iVar10) {
          iVar18 = order_begin;
        }
        if (iVar10 <= local_78.months && local_78.months <= iVar10) goto LAB_017cec6b;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        iVar10 = WindowCursor::GetCell<int>(range_hi,0,uVar14 - 1);
        if (local_78.months <= iVar10) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&local_98,(function<bool_(int,_int)> *)&local_68);
    WVar35.pos = iVar18;
    WVar35.coll = range_lo;
    __last_06.pos = order_end;
    __last_06.coll = range_hi;
    WVar35 = ::std::
             lower_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::LessThan>>
                       (WVar35,__last_06,&local_78.months,
                        (OperationCompare<int,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar35.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017cec6b:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return iVar19;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return iVar19;
  case UINT64:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78._0_8_ = *(undefined8 *)(pvVar11->data + chunk_idx * 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar13 = WindowCursor::GetCell<unsigned_long>(range_hi,0,order_end - 1);
      if (uVar13 < (ulong)local_78._0_8_) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar13 = WindowCursor::GetCell<unsigned_long>(range_lo,0,order_begin);
      if ((ulong)local_78._0_8_ < uVar13) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        uVar13 = WindowCursor::GetCell<unsigned_long>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (uVar13 < (ulong)local_78._0_8_) {
          iVar18 = iVar19;
        }
        if ((ulong)local_78._0_8_ < uVar13) {
          iVar18 = order_begin;
        }
        if ((ulong)local_78._0_8_ >= uVar13 && (ulong)local_78._0_8_ <= uVar13) goto LAB_017ce9e9;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        uVar13 = WindowCursor::GetCell<unsigned_long>(range_hi,0,uVar14 - 1);
        if ((ulong)local_78._0_8_ <= uVar13) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_98,
               (function<bool_(unsigned_long,_unsigned_long)> *)&local_68);
    WVar29.pos = iVar18;
    WVar29.coll = range_lo;
    __last_00.pos = order_end;
    __last_00.coll = range_hi;
    WVar29 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::LessThan>>
                       (WVar29,__last_00,(unsigned_long *)&local_78,
                        (OperationCompare<unsigned_long,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar29.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017ce9e9:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return iVar19;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return iVar19;
  case INT64:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78._0_8_ = *(undefined8 *)(pvVar11->data + chunk_idx * 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar20 = WindowCursor::GetCell<long>(range_hi,0,order_end - 1);
      if (lVar20 < (long)local_78._0_8_) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar20 = WindowCursor::GetCell<long>(range_lo,0,order_begin);
      if ((long)local_78._0_8_ < lVar20) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    iVar18 = order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        lVar20 = WindowCursor::GetCell<long>(range_lo,0,uVar14);
        iVar19 = prev->start;
        if (lVar20 < (long)local_78._0_8_) {
          iVar18 = iVar19;
        }
        if ((long)local_78._0_8_ < lVar20) {
          iVar18 = order_begin;
        }
        if (lVar20 <= (long)local_78._0_8_ && (long)local_78._0_8_ <= lVar20) goto LAB_017cecd6;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        lVar20 = WindowCursor::GetCell<long>(range_hi,0,uVar14 - 1);
        if ((long)local_78._0_8_ <= lVar20) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&local_98,(function<bool_(long,_long)> *)&local_68);
    WVar36.pos = iVar18;
    WVar36.coll = range_lo;
    __last_07.pos = order_end;
    __last_07.coll = range_hi;
    WVar36 = ::std::
             lower_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::LessThan>>
                       (WVar36,__last_07,(long *)&local_78,
                        (OperationCompare<long,_duckdb::LessThan> *)&local_98);
    iVar19 = WVar36.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017cecd6:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return iVar19;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return iVar19;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_017cd3dc_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_unused._M_object = &local_58;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unsupported column type for RANGE","");
    InternalException::InternalException(this,(string *)&local_68);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_40._4_12_ = auVar3;
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78.months = *(int32_t *)(pvVar11->data + chunk_idx * 4);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(range_hi,0,order_end - 1);
      bVar6 = GreaterThan::Operation<float>((float *)&local_78,(float *)&local_40);
      if (bVar6) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(range_lo,0,order_begin);
      bVar6 = GreaterThan::Operation<float>((float *)&local_40,(float *)&local_78);
      if (bVar6) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    pWVar17 = (WindowInputExpression *)order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        fVar25 = WindowCursor::GetCell<float>(range_lo,0,uVar14);
        local_98._0_4_ = fVar25;
        bVar6 = GreaterThan::Operation<float>((float *)&local_98,(float *)&local_78);
        if (bVar6) {
          bVar6 = true;
        }
        else {
          bVar6 = GreaterThan::Operation<float>((float *)&local_78,(float *)&local_98);
          boundary = (WindowInputExpression *)prev->start;
          if (bVar6) {
            pWVar17 = boundary;
          }
        }
        if (bVar6 == false) goto LAB_017cee76;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        fVar25 = WindowCursor::GetCell<float>(range_hi,0,uVar14 - 1);
        local_98._0_4_ = fVar25;
        bVar6 = GreaterThan::Operation<float>((float *)&local_78,(float *)&local_98);
        if (!bVar6) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&local_98,(function<bool_(float,_float)> *)&local_68
              );
    WVar38.pos = (pointer)pWVar17;
    WVar38.coll = range_lo;
    __last_09.pos = order_end;
    __last_09.coll = range_hi;
    WVar38 = ::std::
             lower_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::LessThan>>
                       (WVar38,__last_09,(float *)&local_78,
                        (OperationCompare<float,_duckdb::LessThan> *)&local_98);
    boundary = (WindowInputExpression *)WVar38.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017cee76:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)boundary;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)boundary;
  case DOUBLE:
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78._0_8_ = *(undefined8 *)(pvVar11->data + chunk_idx * 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(range_hi,0,order_end - 1);
      bVar6 = GreaterThan::Operation<double>((double *)&local_78,(double *)&local_40);
      if (bVar6) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(range_lo,0,order_begin);
      bVar6 = GreaterThan::Operation<double>((double *)&local_40,(double *)&local_78);
      if (bVar6) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    pWVar17 = (WindowInputExpression *)order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        local_98._M_unused._0_8_ = (undefined8)WindowCursor::GetCell<double>(range_lo,0,uVar14);
        bVar6 = GreaterThan::Operation<double>((double *)&local_98,(double *)&local_78);
        if (bVar6) {
          bVar6 = true;
        }
        else {
          bVar6 = GreaterThan::Operation<double>((double *)&local_78,(double *)&local_98);
          boundary = (WindowInputExpression *)prev->start;
          if (bVar6) {
            pWVar17 = boundary;
          }
        }
        if (bVar6 == false) goto LAB_017ceda6;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        dVar2 = WindowCursor::GetCell<double>(range_hi,0,uVar14 - 1);
        local_98._M_unused._M_object = (void *)dVar2;
        bVar6 = GreaterThan::Operation<double>((double *)&local_78,(double *)&local_98);
        if (!bVar6) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&local_98,
               (function<bool_(double,_double)> *)&local_68);
    WVar37.pos = (pointer)pWVar17;
    WVar37.coll = range_lo;
    __last_08.pos = order_end;
    __last_08.coll = range_hi;
    WVar37 = ::std::
             lower_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::LessThan>>
                       (WVar37,__last_08,(double *)&local_78,
                        (OperationCompare<double,_duckdb::LessThan> *)&local_98);
    boundary = (WindowInputExpression *)WVar37.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017ceda6:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)boundary;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)boundary;
  case INTERVAL:
    break;
  default:
    if (PVar1 != UINT128) {
      if (PVar1 != INT128) goto switchD_017cd3dc_caseD_a;
      pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
      if (boundary->scalar != false) {
        chunk_idx = 0;
      }
      local_78._0_8_ = *(undefined8 *)(pvVar11->data + chunk_idx * 0x10);
      local_78.micros = *(ulong *)((long)(pvVar11->data + chunk_idx * 0x10) + 8);
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,order_end - 1);
        if ((hVar26.upper < local_78.micros) ||
           (hVar26.lower < (ulong)local_78._0_8_ && local_78.micros == hVar26.upper)) {
          pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_98._M_unused._M_object = &local_88;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"Invalid RANGE PRECEDING value","");
          OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
          __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,order_begin);
        if ((local_78.micros < hVar26.upper) ||
           ((ulong)local_78._0_8_ < hVar26.lower && hVar26.upper == local_78.micros)) {
          pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_98._M_unused._M_object = &local_88;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
          OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
          __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar14 = prev->start;
      pWVar17 = (WindowInputExpression *)order_begin;
      if (uVar14 < prev->end) {
        if (uVar14 < order_end && order_begin <= uVar14) {
          hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,uVar14);
          uVar16 = hVar26.upper;
          uVar14 = hVar26.lower;
          bVar6 = true;
          if (((long)uVar16 <= local_78.micros) &&
             (uVar14 <= (ulong)local_78._0_8_ || uVar16 != local_78.micros)) {
            bVar6 = uVar14 < (ulong)local_78._0_8_ && uVar16 == local_78.micros ||
                    (long)uVar16 < local_78.micros;
            boundary = (WindowInputExpression *)prev->start;
            if (uVar14 < (ulong)local_78._0_8_ && uVar16 == local_78.micros ||
                (long)uVar16 < local_78.micros) {
              pWVar17 = boundary;
            }
          }
          if (!bVar6) goto LAB_017ce97e;
        }
        uVar14 = prev->end;
        if (uVar14 < order_end && order_begin < uVar14) {
          hVar26 = WindowCursor::GetCell<duckdb::hugeint_t>(range_hi,0,uVar14 - 1);
          iVar19 = prev->end + 1;
          iVar18 = iVar19;
          if (local_78.micros == hVar26.upper) {
            iVar18 = order_end;
          }
          if ((ulong)local_78._0_8_ <= hVar26.lower) {
            iVar18 = iVar19;
          }
          if (local_78.micros <= hVar26.upper) {
            order_end = iVar18;
          }
        }
      }
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_98,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_68);
      WVar28.pos = (pointer)pWVar17;
      WVar28.coll = range_lo;
      __last.pos = order_end;
      __last.coll = range_hi;
      WVar28 = ::std::
               lower_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::LessThan>>
                         (WVar28,__last,(hugeint_t *)&local_78,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::LessThan> *)&local_98);
      boundary = (WindowInputExpression *)WVar28.pos;
      if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
      }
LAB_017ce97e:
      if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
        return (idx_t)boundary;
      }
      (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
      return (idx_t)boundary;
    }
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_78._0_8_ = *(undefined8 *)(pvVar11->data + chunk_idx * 0x10);
    local_78.micros = *(int64_t *)(pvVar11->data + chunk_idx * 0x10 + 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,order_end - 1);
      bVar6 = uhugeint_t::operator>((uhugeint_t *)&local_78,&local_40);
      if (bVar6) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,order_begin);
      bVar6 = uhugeint_t::operator>(&local_40,(uhugeint_t *)&local_78);
      if (bVar6) {
        pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_98._M_unused._M_object = &local_88;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
        __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar14 = prev->start;
    pWVar17 = (WindowInputExpression *)order_begin;
    if (uVar14 < prev->end) {
      if (uVar14 < order_end && order_begin <= uVar14) {
        local_98 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,uVar14);
        bVar6 = uhugeint_t::operator>((uhugeint_t *)&local_98,(uhugeint_t *)&local_78);
        if (bVar6) {
          bVar6 = true;
        }
        else {
          bVar6 = uhugeint_t::operator>((uhugeint_t *)&local_78,(uhugeint_t *)&local_98);
          boundary = (WindowInputExpression *)prev->start;
          if (bVar6) {
            pWVar17 = boundary;
          }
        }
        if (bVar6 == false) goto LAB_017cef49;
      }
      uVar14 = prev->end;
      if (uVar14 < order_end && order_begin < uVar14) {
        local_98 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(range_hi,0,uVar14 - 1);
        bVar6 = uhugeint_t::operator>((uhugeint_t *)&local_78,(uhugeint_t *)&local_98);
        if (!bVar6) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
              ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_98,
               (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_68);
    WVar39.pos = (pointer)pWVar17;
    WVar39.coll = range_lo;
    __last_10.pos = order_end;
    __last_10.coll = range_hi;
    WVar39 = ::std::
             lower_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::LessThan>>
                       (WVar39,__last_10,(uhugeint_t *)&local_78,
                        (OperationCompare<duckdb::uhugeint_t,_duckdb::LessThan> *)&local_98);
    boundary = (WindowInputExpression *)WVar39.pos;
    if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
    }
LAB_017cef49:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)boundary;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)boundary;
  }
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
  if (boundary->scalar != false) {
    chunk_idx = 0;
  }
  local_78._0_8_ = *(undefined8 *)(pvVar11->data + chunk_idx * 0x10);
  local_78.micros = *(int64_t *)(pvVar11->data + chunk_idx * 0x10 + 8);
  local_58._M_allocated_capacity = 0;
  local_58._8_8_ = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  if (range == EXPR_PRECEDING_RANGE) {
    iVar27 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,order_end - 1);
    lVar20 = (long)local_78.days + local_78.micros / 86400000000;
    lVar23 = lVar20 % 0x1e;
    lVar24 = (long)local_78.months + lVar20 / 0x1e;
    lVar21 = (iVar27._0_8_ >> 0x20) + iVar27.micros / 86400000000;
    lVar20 = lVar21 % 0x1e;
    lVar21 = (long)iVar27.months + lVar21 / 0x1e;
    if ((lVar21 < lVar24) ||
       ((lVar21 <= lVar24 &&
        ((lVar20 < lVar23 ||
         ((lVar20 <= lVar23 && (iVar27.micros % 86400000000 < local_78.micros % 86400000000))))))))
    {
      pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_98._M_unused._M_object = &local_88;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Invalid RANGE PRECEDING value","");
      OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
      __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar27 = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,order_begin);
    lVar20 = (iVar27._0_8_ >> 0x20) + iVar27.micros / 86400000000;
    lVar23 = lVar20 % 0x1e;
    lVar24 = (long)iVar27.months + lVar20 / 0x1e;
    lVar21 = (long)local_78.days + local_78.micros / 86400000000;
    lVar20 = lVar21 % 0x1e;
    lVar21 = (long)local_78.months + lVar21 / 0x1e;
    if ((lVar21 < lVar24) ||
       ((lVar21 <= lVar24 &&
        ((lVar20 < lVar23 ||
         ((lVar20 <= lVar23 && (local_78.micros % 86400000000 < iVar27.micros % 86400000000))))))))
    {
      pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_98._M_unused._M_object = &local_88;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Invalid RANGE FOLLOWING value","");
      OutOfRangeException::OutOfRangeException(pOVar12,(string *)&local_98);
      __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar14 = prev->start;
  iVar18 = order_begin;
  if (uVar14 < prev->end) {
    if (uVar14 < order_end && order_begin <= uVar14) {
      iVar27 = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,uVar14);
      lVar20 = (iVar27._0_8_ >> 0x20) + iVar27.micros / 86400000000;
      iVar19 = 0xffffffebe228a000;
      lVar24 = iVar27.micros % 86400000000;
      lVar22 = lVar20 % 0x1e;
      lVar23 = (long)iVar27.months + lVar20 / 0x1e;
      lVar21 = (long)local_78.days + local_78.micros / 86400000000;
      lVar20 = lVar21 % 0x1e;
      lVar21 = (long)local_78.months + lVar21 / 0x1e;
      bVar6 = true;
      if ((lVar23 <= lVar21) &&
         ((bVar15 = lVar23 < lVar21, lVar23 < lVar21 ||
          ((lVar22 <= lVar20 && ((lVar22 < lVar20 || (lVar24 <= local_78.micros % 86400000000)))))))
         ) {
        if (lVar23 == lVar21) {
          if (lVar20 <= lVar22) {
            bVar15 = lVar24 < local_78.micros % 86400000000 && lVar22 <= lVar20;
            goto LAB_017ce3ad;
          }
        }
        else {
LAB_017ce3ad:
          if (!bVar15) {
            iVar19 = prev->start;
            bVar6 = false;
            goto LAB_017cef7f;
          }
        }
        iVar18 = prev->start;
      }
LAB_017cef7f:
      if (!bVar6) goto LAB_017cf0c2;
    }
    uVar14 = prev->end;
    if (uVar14 < order_end && order_begin < uVar14) {
      iVar27 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,uVar14 - 1);
      lVar20 = (long)local_78.days + local_78.micros / 86400000000;
      lVar24 = lVar20 % 0x1e;
      lVar23 = (long)local_78.months + lVar20 / 0x1e;
      lVar21 = (iVar27._0_8_ >> 0x20) + iVar27.micros / 86400000000;
      lVar20 = lVar21 % 0x1e;
      lVar21 = (long)iVar27.months + lVar21 / 0x1e;
      if ((lVar23 <= lVar21) &&
         ((lVar23 < lVar21 ||
          ((lVar24 <= lVar20 &&
           ((lVar24 < lVar20 || (local_78.micros % 86400000000 <= iVar27.micros % 86400000000)))))))
         ) {
        order_end = prev->end + 1;
      }
    }
  }
  ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
            ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_98,
             (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_68);
  WVar40.pos = iVar18;
  WVar40.coll = range_lo;
  __last_11.pos = order_end;
  __last_11.coll = range_hi;
  WVar40 = ::std::
           lower_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::LessThan>>
                     (WVar40,__last_11,&local_78,
                      (OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)&local_98);
  iVar19 = WVar40.pos;
  if ((code *)local_88._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_88._M_allocated_capacity)(&local_98,&local_98,3);
  }
LAB_017cf0c2:
  if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
    return iVar19;
  }
  (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
  return iVar19;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}